

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain_vine_swap.h
# Opt level: O1

Index __thiscall
Gudhi::persistence_matrix::
Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
::vine_swap(Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
            *this,Index columnIndex1,Index columnIndex2)

{
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
  *pIVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  Pos_index PVar5;
  ID_index IVar6;
  Dimension DVar7;
  pointer puVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  bool bVar12;
  Pos_index PVar13;
  Pos_index PVar14;
  Index IVar15;
  pointer p;
  long *plVar16;
  invalid_argument *this_00;
  const_iterator __end0;
  long *plVar17;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
  *pIVar18;
  long lVar19;
  ulong uVar20;
  anon_class_1_0_00000001 local_54;
  anon_class_1_0_00000001 local_53;
  anon_class_1_0_00000001 local_52;
  anon_class_1_0_00000001 local_51;
  long local_50;
  Index local_44;
  long local_40;
  anon_class_8_1_e4bd5e45 local_38;
  
  puVar8 = (this->super_type).pivotToPosition_.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar9 = (long)this[1].super_type.
                super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
                .barcode_.
                super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  lVar19 = (ulong)columnIndex1 * 0x30;
  uVar2 = *(uint *)(lVar9 + 4 + lVar19);
  local_50 = (ulong)columnIndex2 * 0x30;
  uVar3 = puVar8[uVar2];
  uVar4 = puVar8[*(uint *)(lVar9 + 4 + local_50)];
  iVar10 = uVar3 - uVar4;
  if (uVar3 < uVar4) {
    iVar10 = -(uVar3 - uVar4);
  }
  local_44 = columnIndex2;
  if (iVar10 != 1) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_00,
               "Chain_vine_swap::vine_swap - Columns to be swapped need to be adjacent in the \'real\' matrix."
              );
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  PVar13 = Chain_barcode_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
           ::death(&this->super_type,uVar2);
  lVar11 = (ulong)columnIndex2 * 0x30;
  uVar2 = *(uint *)((long)this[1].super_type.
                          super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
                          .barcode_.
                          super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 4 + lVar11);
  PVar5 = (this->super_type).pivotToPosition_.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar2];
  PVar14 = Chain_barcode_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
           ::death(&this->super_type,uVar2);
  lVar9 = (long)this[1].super_type.
                super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
                .barcode_.
                super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  uVar2 = *(uint *)(lVar9 + 4 + lVar19);
  plVar17 = (long *)(lVar9 + lVar11 + 0x20);
  local_40 = lVar19;
  if ((PVar13 == uVar3) && (plVar16 = plVar17, PVar14 == PVar5)) {
    do {
      plVar16 = (long *)*plVar16;
      if (plVar16 == plVar17) goto LAB_001661d1;
      if (plVar16 == (long *)0x0) {
LAB_0016642b:
        __assert_fail("!!p","/usr/include/boost/intrusive/detail/hook_traits.hpp",0x3e,
                      "static pointer boost::intrusive::bhtraits_base<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, true, false, false, false>>>, boost::intrusive::list_node<void *> *, Gudhi::persistence_matrix::Matrix<Chain_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, true, false, false, false>>::Matrix_column_tag, 1>::to_value_ptr(const node_ptr &) [T = Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, true, false, false, false>>>, NodePtr = boost::intrusive::list_node<void *> *, Tag = Gudhi::persistence_matrix::Matrix<Chain_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, true, false, false, false>>::Matrix_column_tag, Type = 1]"
                     );
      }
    } while (*(uint *)(plVar16 + 2) != uVar2);
    if (plVar16 != plVar17) {
      IVar15 = _negative_vine_swap(this,columnIndex1,local_44);
      return IVar15;
    }
LAB_001661d1:
    uVar3 = *(uint *)(lVar9 + 4 + local_50);
    uVar20 = (ulong)uVar3;
    Chain_barcode_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
    ::negative_transpose(&this->super_type,uVar2,uVar3);
  }
  else {
    plVar16 = plVar17;
    if (PVar13 == uVar3) {
      do {
        plVar16 = (long *)*plVar16;
        if (plVar16 == plVar17) goto LAB_001662cb;
        if (plVar16 == (long *)0x0) goto LAB_0016642b;
      } while (*(uint *)(plVar16 + 2) != uVar2);
      if (plVar16 != plVar17) {
        pIVar1 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
                  *)(lVar9 + lVar19);
        uVar2 = *(uint *)(lVar9 + 4 + lVar19);
        pIVar18 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
                   *)(lVar9 + local_50);
        local_38.targetColumn = pIVar1;
        bVar12 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>const&,Gudhi::persistence_matrix::Intrusive_list_c___ersistence_matrix::Column_types)7,false,true,false,false,false>>__Matrix_column_tag_1u>_false>___1_>
                           (pIVar18,pIVar1,&local_51,&local_38,&local_52,&local_53,&local_54);
        if (bVar12) {
          IVar6 = (pIVar1->super_Chain_column_option).pivot_;
          (pIVar1->super_Chain_column_option).pivot_ = (pIVar18->super_Chain_column_option).pivot_;
          (pIVar18->super_Chain_column_option).pivot_ = IVar6;
          DVar7 = (pIVar1->super_Column_dimension_option).dim_;
          (pIVar1->super_Column_dimension_option).dim_ =
               (pIVar18->super_Column_dimension_option).dim_;
          (pIVar18->super_Column_dimension_option).dim_ = DVar7;
        }
        uVar3 = (pIVar1->super_Chain_column_option).pivot_;
        if (uVar2 != uVar3) {
          puVar8 = this[1].super_type.
                   super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
                   .indexToBar_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          uVar4 = puVar8[uVar2];
          puVar8[uVar2] = puVar8[uVar3];
          puVar8[uVar3] = uVar4;
        }
        puVar8 = (this->super_type).pivotToPosition_.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar9 = (long)this[1].super_type.
                      super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
                      .barcode_.
                      super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        uVar2 = *(uint *)(lVar9 + 4 + local_40);
        uVar3 = *(uint *)(lVar9 + 4 + local_50);
        uVar4 = puVar8[uVar2];
        puVar8[uVar2] = puVar8[uVar3];
        puVar8[uVar3] = uVar4;
        return local_44;
      }
LAB_001662cb:
      uVar3 = *(uint *)(lVar9 + 4 + local_50);
      uVar20 = (ulong)uVar3;
      Chain_barcode_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
      ::negative_positive_transpose(&this->super_type,uVar2,uVar3);
    }
    else if (PVar14 == PVar5) {
      do {
        plVar16 = (long *)*plVar16;
        if (plVar16 == plVar17) goto LAB_001663ec;
        if (plVar16 == (long *)0x0) goto LAB_0016642b;
      } while (*(uint *)(plVar16 + 2) != uVar2);
      if (plVar16 != plVar17) {
        pIVar1 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
                  *)(lVar9 + local_50);
        uVar2 = *(uint *)(lVar9 + 4 + local_50);
        pIVar18 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
                   *)(lVar9 + lVar19);
        local_38.targetColumn = pIVar1;
        bVar12 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>const&,Gudhi::persistence_matrix::Intrusive_list_c___ersistence_matrix::Column_types)7,false,true,false,false,false>>__Matrix_column_tag_1u>_false>___1_>
                           (pIVar18,pIVar1,&local_51,&local_38,&local_52,&local_53,&local_54);
        if (bVar12) {
          IVar6 = (pIVar1->super_Chain_column_option).pivot_;
          (pIVar1->super_Chain_column_option).pivot_ = (pIVar18->super_Chain_column_option).pivot_;
          (pIVar18->super_Chain_column_option).pivot_ = IVar6;
          DVar7 = (pIVar1->super_Column_dimension_option).dim_;
          (pIVar1->super_Column_dimension_option).dim_ =
               (pIVar18->super_Column_dimension_option).dim_;
          (pIVar18->super_Column_dimension_option).dim_ = DVar7;
        }
        uVar3 = (pIVar1->super_Chain_column_option).pivot_;
        if (uVar2 != uVar3) {
          puVar8 = this[1].super_type.
                   super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
                   .indexToBar_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          uVar4 = puVar8[uVar2];
          puVar8[uVar2] = puVar8[uVar3];
          puVar8[uVar3] = uVar4;
        }
        lVar9 = (long)this[1].super_type.
                      super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
                      .barcode_.
                      super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        uVar2 = *(uint *)(lVar9 + 4 + local_40);
        uVar3 = *(uint *)(lVar9 + 4 + local_50);
        Chain_barcode_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
        ::positive_negative_transpose(&this->super_type,uVar2,uVar3);
        puVar8 = (this->super_type).pivotToPosition_.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar4 = puVar8[uVar2];
        puVar8[uVar2] = puVar8[uVar3];
        puVar8[uVar3] = uVar4;
        return columnIndex1;
      }
LAB_001663ec:
      uVar3 = *(uint *)(lVar9 + 4 + local_50);
      uVar20 = (ulong)uVar3;
      Chain_barcode_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
      ::positive_negative_transpose(&this->super_type,uVar2,uVar3);
    }
    else {
      do {
        plVar16 = (long *)*plVar16;
        if (plVar16 == plVar17) goto LAB_001663d2;
        if (plVar16 == (long *)0x0) goto LAB_0016642b;
      } while (*(uint *)(plVar16 + 2) != uVar2);
      if (plVar16 != plVar17) {
        IVar15 = _positive_vine_swap(this,columnIndex1,local_44);
        return IVar15;
      }
LAB_001663d2:
      uVar3 = *(uint *)(lVar9 + 4 + local_50);
      uVar20 = (ulong)uVar3;
      Chain_barcode_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
      ::positive_transpose(&this->super_type,uVar2,uVar3);
    }
  }
  puVar8 = (this->super_type).pivotToPosition_.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = puVar8[uVar2];
  puVar8[uVar2] = puVar8[uVar20];
  puVar8[uVar20] = uVar3;
  return columnIndex1;
}

Assistant:

inline typename Chain_vine_swap<Master_matrix>::Index Chain_vine_swap<Master_matrix>::vine_swap(Index columnIndex1,
                                                                                                Index columnIndex2)
{
  if constexpr (Master_matrix::Option_list::has_column_pairings) {
    GUDHI_CHECK(CP::are_adjacent(_matrix()->get_pivot(columnIndex1), _matrix()->get_pivot(columnIndex2)),
                std::invalid_argument(
                    "Chain_vine_swap::vine_swap - Columns to be swapped need to be adjacent in the 'real' matrix."));
  }

  const bool col1IsNeg = _is_negative_in_pair(columnIndex1);
  const bool col2IsNeg = _is_negative_in_pair(columnIndex2);

  if (col1IsNeg && col2IsNeg) {
    if (_matrix()->is_zero_entry(columnIndex2, _matrix()->get_pivot(columnIndex1))) {
      if constexpr (Master_matrix::Option_list::has_column_pairings) {
        ID_index pivot1 = _matrix()->get_pivot(columnIndex1);
        ID_index pivot2 = _matrix()->get_pivot(columnIndex2);

        CP::negative_transpose(pivot1, pivot2);
        CP::swap_positions(pivot1, pivot2);
      }
      return columnIndex1;
    }
    return _negative_vine_swap(columnIndex1, columnIndex2);
  }

  if (col1IsNeg) {
    if (_matrix()->is_zero_entry(columnIndex2, _matrix()->get_pivot(columnIndex1))) {
      if constexpr (Master_matrix::Option_list::has_column_pairings) {
        ID_index pivot1 = _matrix()->get_pivot(columnIndex1);
        ID_index pivot2 = _matrix()->get_pivot(columnIndex2);

        CP::negative_positive_transpose(pivot1, pivot2);
        CP::swap_positions(pivot1, pivot2);
      }
      return columnIndex1;
    }
    return _negative_positive_vine_swap(columnIndex1, columnIndex2);
  }

  if (col2IsNeg) {
    if (_matrix()->is_zero_entry(columnIndex2, _matrix()->get_pivot(columnIndex1))) {
      if constexpr (Master_matrix::Option_list::has_column_pairings) {
        ID_index pivot1 = _matrix()->get_pivot(columnIndex1);
        ID_index pivot2 = _matrix()->get_pivot(columnIndex2);

        CP::positive_negative_transpose(pivot1, pivot2);
        CP::swap_positions(pivot1, pivot2);
      }
      return columnIndex1;
    }
    return _positive_negative_vine_swap(columnIndex1, columnIndex2);
  }

  if (_matrix()->is_zero_entry(columnIndex2, _matrix()->get_pivot(columnIndex1))) {
    if constexpr (Master_matrix::Option_list::has_column_pairings) {
      ID_index pivot1 = _matrix()->get_pivot(columnIndex1);
      ID_index pivot2 = _matrix()->get_pivot(columnIndex2);

      CP::positive_transpose(pivot1, pivot2);
      CP::swap_positions(pivot1, pivot2);
    }
    return columnIndex1;
  }
  return _positive_vine_swap(columnIndex1, columnIndex2);
}